

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.h
# Opt level: O1

void FileUtil::readSparseMatrixLocally
               (SparseMatrix *R,SparseMatrix *Rt,
               unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
               *user_item_R,
               unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
               *item_user_R,int start_user_id,int end_user_id,int start_item_id,int end_item_id)

{
  int iVar1;
  long *plVar2;
  pointer ppVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *pvVar6;
  long *plVar7;
  ulong uVar8;
  long *plVar9;
  long lVar10;
  int local_4c;
  pair<int,_double> local_48;
  int local_34;
  
  local_4c = start_user_id;
  local_34 = end_user_id;
  if (start_user_id < end_user_id) {
    do {
      uVar8 = (ulong)(long)local_4c % *(ulong *)(user_item_R + 8);
      plVar2 = *(long **)(*(long *)user_item_R + uVar8 * 8);
      plVar7 = (long *)0x0;
      if ((plVar2 != (long *)0x0) &&
         (plVar7 = plVar2, plVar9 = (long *)*plVar2, local_4c != *(int *)((long *)*plVar2 + 1))) {
        while (plVar2 = (long *)*plVar9, plVar2 != (long *)0x0) {
          plVar7 = (long *)0x0;
          if (((ulong)(long)(int)plVar2[1] % *(ulong *)(user_item_R + 8) != uVar8) ||
             (plVar7 = plVar9, plVar9 = plVar2, local_4c == (int)plVar2[1])) goto LAB_00122727;
        }
        plVar7 = (long *)0x0;
      }
LAB_00122727:
      if ((plVar7 == (long *)0x0) || (*plVar7 == 0)) {
        pmVar5 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)user_item_R,&local_4c);
        ppVar3 = (pmVar5->
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        (pmVar5->
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pmVar5->
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pmVar5->
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppVar3 != (pointer)0x0) {
          operator_delete(ppVar3);
        }
      }
      iVar1 = Rt->ccs_col_ptr[local_4c];
      lVar10 = (long)iVar1;
      if ((Rt->ccs_col_ptr[(long)local_4c + 1] != iVar1) &&
         (iVar1 < Rt->ccs_col_ptr[(long)local_4c + 1])) {
        do {
          pvVar6 = (vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                   std::__detail::
                   _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)user_item_R,&local_4c);
          local_48.first = Rt->ccs_row_idx[lVar10];
          local_48.second = Rt->ccs_rating_scores[lVar10];
          iVar4._M_current = *(pair<int,_double> **)(pvVar6 + 8);
          if (iVar4._M_current == *(pair<int,_double> **)(pvVar6 + 0x10)) {
            std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
            _M_realloc_insert<std::pair<int,double>>(pvVar6,iVar4,&local_48);
          }
          else {
            *(ulong *)iVar4._M_current = CONCAT44(local_48._4_4_,local_48.first);
            (iVar4._M_current)->second = local_48.second;
            *(long *)(pvVar6 + 8) = *(long *)(pvVar6 + 8) + 0x10;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < Rt->ccs_col_ptr[(long)local_4c + 1]);
      }
      local_4c = local_4c + 1;
    } while (local_4c < local_34);
  }
  local_4c = start_item_id;
  if (start_item_id < end_item_id) {
    do {
      uVar8 = (ulong)(long)local_4c % *(ulong *)(item_user_R + 8);
      plVar2 = *(long **)(*(long *)item_user_R + uVar8 * 8);
      plVar7 = (long *)0x0;
      if ((plVar2 != (long *)0x0) &&
         (plVar7 = plVar2, plVar9 = (long *)*plVar2, local_4c != *(int *)((long *)*plVar2 + 1))) {
        while (plVar2 = (long *)*plVar9, plVar2 != (long *)0x0) {
          plVar7 = (long *)0x0;
          if (((ulong)(long)(int)plVar2[1] % *(ulong *)(item_user_R + 8) != uVar8) ||
             (plVar7 = plVar9, plVar9 = plVar2, local_4c == (int)plVar2[1])) goto LAB_00122874;
        }
        plVar7 = (long *)0x0;
      }
LAB_00122874:
      if ((plVar7 == (long *)0x0) || (*plVar7 == 0)) {
        pmVar5 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)item_user_R,&local_4c);
        ppVar3 = (pmVar5->
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        (pmVar5->
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pmVar5->
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pmVar5->
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppVar3 != (pointer)0x0) {
          operator_delete(ppVar3);
        }
      }
      iVar1 = R->ccs_col_ptr[local_4c];
      lVar10 = (long)iVar1;
      if ((R->ccs_col_ptr[(long)local_4c + 1] != iVar1) &&
         (iVar1 < R->ccs_col_ptr[(long)local_4c + 1])) {
        do {
          pvVar6 = (vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                   std::__detail::
                   _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)item_user_R,&local_4c);
          local_48.first = R->ccs_row_idx[lVar10];
          local_48.second = R->ccs_rating_scores[lVar10];
          iVar4._M_current = *(pair<int,_double> **)(pvVar6 + 8);
          if (iVar4._M_current == *(pair<int,_double> **)(pvVar6 + 0x10)) {
            std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
            _M_realloc_insert<std::pair<int,double>>(pvVar6,iVar4,&local_48);
          }
          else {
            *(ulong *)iVar4._M_current = CONCAT44(local_48._4_4_,local_48.first);
            (iVar4._M_current)->second = local_48.second;
            *(long *)(pvVar6 + 8) = *(long *)(pvVar6 + 8) + 0x10;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < R->ccs_col_ptr[(long)local_4c + 1]);
      }
      local_4c = local_4c + 1;
    } while (local_4c < end_item_id);
  }
  return;
}

Assistant:

void readSparseMatrixLocally(const SparseMatrix &R, const SparseMatrix &Rt, unordered_map<int, vector<pair<int, value_type > > > &user_item_R,
                                 unordered_map<int, vector<pair<int, value_type > > > &item_user_R,
                                 const int start_user_id, const int end_user_id, const int start_item_id,
                                 const int end_item_id) {

        for (int user_id = start_user_id; user_id < end_user_id; user_id++) {

            if(user_item_R.find(user_id)==user_item_R.end()){
                user_item_R[user_id] = vector<pair<int, value_type > >();
            }

            // empty column
            if (Rt.ccs_col_ptr[user_id + 1] == Rt.ccs_col_ptr[user_id]) {
                continue;
            }

            for (int idx = Rt.ccs_col_ptr[user_id]; idx < Rt.ccs_col_ptr[user_id + 1]; idx++) {
                user_item_R[user_id].push_back(std::make_pair(Rt.ccs_row_idx[idx], Rt.ccs_rating_scores[idx]));
            }
        }

        for (int item_id = start_item_id; item_id < end_item_id; item_id++) {

            if(item_user_R.find(item_id)==item_user_R.end()){
                item_user_R[item_id] = vector<pair<int, value_type > >();
            }

            // empty column
            if (R.ccs_col_ptr[item_id + 1] == R.ccs_col_ptr[item_id]) {
                continue;
            }

            for (int idx = R.ccs_col_ptr[item_id]; idx < R.ccs_col_ptr[item_id + 1]; idx++) {
                item_user_R[item_id].push_back(std::make_pair(R.ccs_row_idx[idx], R.ccs_rating_scores[idx]));
            }
        }

    }